

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install.cpp
# Opt level: O1

unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
__thiscall
duckdb::InstallFromHttpUrl
          (duckdb *this,DatabaseInstance *db,string *url,string *extension_name,string *temp_path,
          string *param_5,ExtensionInstallOptions *options,
          optional_ptr<duckdb::HTTPLogger,_true> http_logger)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  double dVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4;
  bool bVar6;
  unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
  __ptr;
  Client CVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> uVar10;
  unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> uVar11;
  int iVar12;
  long lVar13;
  pointer pFVar14;
  type pFVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  pointer pEVar17;
  ulong uVar18;
  int *piVar19;
  const_iterator cVar20;
  ExtensionInstallInfo *this_00;
  HTTPException *this_01;
  IOException *this_02;
  uint uVar21;
  Error error;
  size_type *this_03;
  char *pcVar22;
  string *psVar23;
  string *params_1;
  int iVar24;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar25;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar26;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  undefined1 auStack_458 [16];
  unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
  install_info;
  Client cli;
  undefined1 local_438 [32];
  unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> fs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  string *local_3f8;
  DatabaseInstance *local_3f0;
  ExtensionInstallInfo info;
  string decompressed_body;
  unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> fs_1;
  undefined1 local_318 [40];
  _Alloc_hider local_2f0;
  __uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  local_2e8;
  optional_ptr<duckdb::HTTPLogger,_true> http_logger_local;
  ulong local_2d0;
  HTTPLogger *local_2c8;
  undefined8 uStack_2c0;
  code *local_2b8;
  undefined8 uStack_2b0;
  string *local_2a0;
  string *local_298;
  string *local_290;
  string *local_288;
  HTTPUtil *local_280;
  DBConfig *local_278;
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> url_base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> url_local_part;
  undefined1 local_1f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  char local_1c0 [16];
  string no_http;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> hostname_without_http;
  string local_50;
  
  http_logger_local = http_logger;
  pcVar4 = (url->_M_dataplus)._M_p;
  params_1 = temp_path;
  local_3f8 = extension_name;
  local_3f0 = db;
  local_2e8._M_t.
  super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl =
       (tuple<duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>)
       (tuple<duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>)
       this;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar4,pcVar4 + url->_M_string_length);
  info._0_8_ = &info.full_path._M_string_length;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&info,"http://","");
  fs_1.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
  super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
  super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)
       (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)local_318;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&fs_1,anon_var_dwarf_4f001a4 + 9);
  StringUtil::Replace((string *)&no_http,&local_110,(string *)&info,(string *)&fs_1);
  if (fs_1.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
      super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
      super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl !=
      (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)local_318) {
    operator_delete((void *)fs_1.
                            super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                            .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl);
  }
  if ((size_type *)info._0_8_ != &info.full_path._M_string_length) {
    operator_delete((void *)info._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  lVar13 = ::std::__cxx11::string::find((char)&no_http,0x2f);
  if (lVar13 == -1) {
    this_02 = (IOException *)__cxa_allocate_exception(0x10);
    info._0_8_ = &info.full_path._M_string_length;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&info,"No slash in URL template","")
    ;
    IOException::IOException(this_02,(string *)&info);
    __cxa_throw(this_02,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::substr((ulong)&hostname_without_http,(ulong)&no_http);
  ::std::__cxx11::string::substr((ulong)&url_local_part,(ulong)&no_http);
  install_info.
  super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
       )(__uniq_ptr_data<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true,_true>
         )0x0;
  FileSystem::CreateLocal();
  pFVar14 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
            operator->(&fs_1);
  info._0_8_ = &info.full_path._M_string_length;
  pcVar4 = (param_5->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&info,pcVar4,pcVar4 + param_5->_M_string_length);
  ::std::__cxx11::string::append((char *)&info);
  iVar12 = (*pFVar14->_vptr_FileSystem[0x12])(pFVar14,&info,0);
  if ((size_type *)info._0_8_ != &info.full_path._M_string_length) {
    operator_delete((void *)info._0_8_);
  }
  local_298 = param_5;
  if ((char)iVar12 != '\0') {
    pFVar15 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
              operator*(&fs_1);
    info._0_8_ = &info.full_path._M_string_length;
    pcVar4 = (param_5->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&info,pcVar4,pcVar4 + param_5->_M_string_length);
    ::std::__cxx11::string::append((char *)&info);
    ExtensionInstallInfo::TryReadInfoFile
              ((ExtensionInstallInfo *)&decompressed_body,pFVar15,(string *)&info,local_3f8);
    _Var9 = decompressed_body._M_dataplus;
    __ptr = install_info;
    decompressed_body._M_dataplus._M_p = (pointer)0x0;
    install_info.
    super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
    .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          )(unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
            )_Var9._M_p;
    if (__ptr.
        super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
        .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true,_true>
         )0x0) {
      ::std::default_delete<duckdb::ExtensionInstallInfo>::operator()
                ((default_delete<duckdb::ExtensionInstallInfo> *)&install_info,
                 (ExtensionInstallInfo *)
                 __ptr.
                 super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                 .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl);
    }
    if (decompressed_body._M_dataplus._M_p != (pointer)0x0) {
      ::std::default_delete<duckdb::ExtensionInstallInfo>::operator()
                ((default_delete<duckdb::ExtensionInstallInfo> *)&decompressed_body,
                 (ExtensionInstallInfo *)decompressed_body._M_dataplus._M_p);
    }
    decompressed_body._M_dataplus._M_p = (pointer)0x0;
    if ((size_type *)info._0_8_ != &info.full_path._M_string_length) {
      operator_delete((void *)info._0_8_);
    }
  }
  if (fs_1.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
      super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
      super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true,_true>)0x0)
  {
    (**(code **)(*(long *)fs_1.
                          super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                          .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl + 8))();
  }
  local_2a0 = temp_path;
  ::std::operator+(&url_base,"http://",&hostname_without_http);
  local_318._24_8_ = local_318 + 8;
  fs_1.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
  super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
  super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)
       (__uniq_ptr_data<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true,_true>)0x0
  ;
  local_318._8_4_ = 0;
  local_318._16_8_ = (_Base_ptr)0x0;
  local_2f0._M_p = (pointer)0x0;
  local_278 = &local_3f0->config;
  local_280 = (HTTPUtil *)&(local_3f0->config).options.http_proxy;
  local_288 = &(local_3f0->config).options.http_proxy_username;
  local_290 = &(local_3f0->config).options.http_proxy_password;
  local_2d0 = 0;
  local_318._32_8_ = local_318._24_8_;
  do {
    ::std::__cxx11::string::string((string *)&fs,url_base._M_dataplus._M_p,(allocator *)local_438);
    info._0_8_ = &info.full_path._M_string_length;
    info.full_path._M_dataplus._M_p = (pointer)0x0;
    info.full_path._M_string_length = info.full_path._M_string_length & 0xffffffffffffff00;
    decompressed_body._M_string_length = 0;
    decompressed_body.field_2._M_local_buf[0] = '\0';
    decompressed_body._M_dataplus._M_p = (pointer)&decompressed_body.field_2;
    duckdb_httplib::Client::Client(&cli,(string *)&fs,(string *)&info,&decompressed_body);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decompressed_body._M_dataplus._M_p != &decompressed_body.field_2) {
      operator_delete(decompressed_body._M_dataplus._M_p);
    }
    if ((size_type *)info._0_8_ != &info.full_path._M_string_length) {
      operator_delete((void *)info._0_8_);
    }
    if (fs.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
        super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
        super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl !=
        (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)&local_408) {
      operator_delete((void *)fs.
                              super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                              .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl);
    }
    if ((local_3f0->config).options.http_proxy._M_string_length != 0) {
      info._0_8_ = &info.full_path._M_string_length;
      info.full_path._M_dataplus._M_p = (pointer)0x0;
      info.full_path._M_string_length = info.full_path._M_string_length & 0xffffffffffffff00;
      HTTPUtil::ParseHTTPProxyHost
                (local_280,(string *)&info,(string *)&decompressed_body,(idx_t *)0x50,
                 (idx_t)params_1);
      iVar12 = NumericCastImpl<int,_unsigned_long,_false>::Convert
                         ((unsigned_long)decompressed_body._M_dataplus._M_p);
      CVar7 = cli;
      ::std::__cxx11::string::_M_assign
                ((string *)
                 ((long)cli.cli_._M_t.
                        super___uniq_ptr_impl<duckdb_httplib::ClientImpl,_std::default_delete<duckdb_httplib::ClientImpl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb_httplib::ClientImpl_*,_std::default_delete<duckdb_httplib::ClientImpl>_>
                        .super__Head_base<0UL,_duckdb_httplib::ClientImpl_*,_false>._M_head_impl +
                 0x268));
      *(int *)((long)CVar7.cli_._M_t.
                     super___uniq_ptr_impl<duckdb_httplib::ClientImpl,_std::default_delete<duckdb_httplib::ClientImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb_httplib::ClientImpl_*,_std::default_delete<duckdb_httplib::ClientImpl>_>
                     .super__Head_base<0UL,_duckdb_httplib::ClientImpl_*,_false>._M_head_impl +
              0x288) = iVar12;
      if ((size_type *)info._0_8_ != &info.full_path._M_string_length) {
        operator_delete((void *)info._0_8_);
      }
    }
    CVar7.cli_._M_t.
    super___uniq_ptr_impl<duckdb_httplib::ClientImpl,_std::default_delete<duckdb_httplib::ClientImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb_httplib::ClientImpl_*,_std::default_delete<duckdb_httplib::ClientImpl>_>
    .super__Head_base<0UL,_duckdb_httplib::ClientImpl_*,_false>._M_head_impl =
         cli.cli_._M_t.
         super___uniq_ptr_impl<duckdb_httplib::ClientImpl,_std::default_delete<duckdb_httplib::ClientImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb_httplib::ClientImpl_*,_std::default_delete<duckdb_httplib::ClientImpl>_>
         .super__Head_base<0UL,_duckdb_httplib::ClientImpl_*,_false>._M_head_impl;
    this_03 = &info.full_path._M_string_length;
    if ((local_3f0->config).options.http_proxy_password._M_string_length != 0 ||
        (local_3f0->config).options.http_proxy_username._M_string_length != 0) {
      ::std::__cxx11::string::_M_assign
                ((string *)
                 ((long)cli.cli_._M_t.
                        super___uniq_ptr_impl<duckdb_httplib::ClientImpl,_std::default_delete<duckdb_httplib::ClientImpl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb_httplib::ClientImpl_*,_std::default_delete<duckdb_httplib::ClientImpl>_>
                        .super__Head_base<0UL,_duckdb_httplib::ClientImpl_*,_false>._M_head_impl +
                 0x290));
      ::std::__cxx11::string::_M_assign
                ((string *)
                 ((long)CVar7.cli_._M_t.
                        super___uniq_ptr_impl<duckdb_httplib::ClientImpl,_std::default_delete<duckdb_httplib::ClientImpl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb_httplib::ClientImpl_*,_std::default_delete<duckdb_httplib::ClientImpl>_>
                        .super__Head_base<0UL,_duckdb_httplib::ClientImpl_*,_false>._M_head_impl +
                 0x2b0));
    }
    if (http_logger_local.ptr != (HTTPLogger *)0x0) {
      optional_ptr<duckdb::HTTPLogger,_true>::CheckValid(&http_logger_local);
      uStack_2c0 = 0;
      local_2c8 = http_logger_local.ptr;
      info.full_path.field_2._M_allocated_capacity =
           (size_type)
           ::std::
           _Function_handler<void_(const_duckdb_httplib::Request_&,_const_duckdb_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/logging/http_logger.hpp:35:10)>
           ::_M_invoke;
      info._0_8_ = http_logger_local.ptr;
      info.full_path._M_dataplus._M_p = (pointer)0x0;
      info.full_path._M_string_length =
           (size_type)
           ::std::
           _Function_handler<void_(const_duckdb_httplib::Request_&,_const_duckdb_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/logging/http_logger.hpp:35:10)>
           ::_M_manager;
      local_2b8 = (code *)0x0;
      uStack_2b0 = 0;
      ::std::function<void_(const_duckdb_httplib::Request_&,_const_duckdb_httplib::Response_&)>::
      operator=((function<void_(const_duckdb_httplib::Request_&,_const_duckdb_httplib::Response_&)>
                 *)((long)cli.cli_._M_t.
                          super___uniq_ptr_impl<duckdb_httplib::ClientImpl,_std::default_delete<duckdb_httplib::ClientImpl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb_httplib::ClientImpl_*,_std::default_delete<duckdb_httplib::ClientImpl>_>
                          .super__Head_base<0UL,_duckdb_httplib::ClientImpl_*,_false>._M_head_impl +
                   0x2f0),
                (function<void_(const_duckdb_httplib::Request_&,_const_duckdb_httplib::Response_&)>
                 *)&info);
      if (info.full_path._M_string_length != 0) {
        (*(code *)info.full_path._M_string_length)(&info,&info,3);
      }
      if (local_2b8 != (code *)0x0) {
        (*local_2b8)(&local_2c8,&local_2c8,3);
      }
    }
    local_250[0] = local_240;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"%s %s","");
    DBConfig::UserAgent_abi_cxx11_((string *)&local_1d0,local_278);
    pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              DuckDB::SourceID();
    StringUtil::Format<std::__cxx11::string,char_const*>
              ((string *)&fs,(StringUtil *)local_250,(string *)&local_1d0,pbVar16,(char *)params_1);
    ::std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&info,(char (*) [11])"User-Agent",(string *)&fs);
    __l._M_len = 1;
    __l._M_array = (iterator)&info;
    ::std::
    multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&decompressed_body,__l,(ci *)local_438,(allocator_type *)(auStack_458 + 0xf));
    if ((size_type *)info.full_path.field_2._8_8_ != &info.repository_url._M_string_length) {
      operator_delete((void *)info.full_path.field_2._8_8_);
    }
    if ((size_type *)info._0_8_ != this_03) {
      operator_delete((void *)info._0_8_);
    }
    if (fs.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
        super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
        super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl !=
        (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)&local_408) {
      operator_delete((void *)fs.
                              super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                              .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl);
    }
    if ((char *)local_1d0._M_allocated_capacity != local_1c0) {
      operator_delete((void *)local_1d0._M_allocated_capacity);
    }
    if (local_250[0] != local_240) {
      operator_delete(local_250[0]);
    }
    if (((options->use_etags == true) &&
        (install_info.
         super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
         .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl !=
         (__uniq_ptr_data<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true,_true>
          )0x0)) &&
       (pEVar17 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                  ::operator->(&install_info), (pEVar17->etag)._M_string_length != 0)) {
      local_270[0] = local_260;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"%s","");
      pEVar17 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                ::operator->(&install_info);
      pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_1f0 + 0x10);
      pcVar4 = (pEVar17->etag)._M_dataplus._M_p;
      local_1f0._0_8_ = pbVar16;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f0,pcVar4,pcVar4 + (pEVar17->etag)._M_string_length);
      StringUtil::Format<std::__cxx11::string>
                ((string *)&fs,(StringUtil *)local_270,(string *)local_1f0,pbVar16);
      ::std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&info,(char (*) [14])"If-None-Match",(string *)&fs);
      pVar25 = ::std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::_M_get_insert_equal_pos
                         ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&decompressed_body,(key_type *)&info);
      local_438._0_8_ = &decompressed_body;
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,duckdb_httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::
      _M_insert_<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,duckdb_httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::_Alloc_node>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,duckdb_httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&decompressed_body,pVar25.first,pVar25.second,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&info,(_Alloc_node *)local_438);
      if ((size_type *)info.full_path.field_2._8_8_ != &info.repository_url._M_string_length) {
        operator_delete((void *)info.full_path.field_2._8_8_);
      }
      if ((size_type *)info._0_8_ != &info.full_path._M_string_length) {
        operator_delete((void *)info._0_8_);
      }
      if (fs.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
          super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
          super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl !=
          (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)&local_408) {
        operator_delete((void *)fs.
                                super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                                .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl);
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1f0 + 0x10)) {
        operator_delete((void *)local_1f0._0_8_);
      }
      if (local_270[0] != local_260) {
        operator_delete(local_270[0]);
      }
    }
    ::std::__cxx11::string::string
              ((string *)local_438,url_local_part._M_dataplus._M_p,(allocator *)(auStack_458 + 0xf))
    ;
    local_408._M_allocated_capacity = 0;
    local_408._8_8_ = 0;
    fs.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
    super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
    super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)
         (__uniq_ptr_data<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true,_true>)
         0x0;
    params_1 = (string *)&fs;
    duckdb_httplib::ClientImpl::Get
              ((Result *)&info,
               (ClientImpl *)
               cli.cli_._M_t.
               super___uniq_ptr_impl<duckdb_httplib::ClientImpl,_std::default_delete<duckdb_httplib::ClientImpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_httplib::ClientImpl_*,_std::default_delete<duckdb_httplib::ClientImpl>_>
               .super__Head_base<0UL,_duckdb_httplib::ClientImpl_*,_false>._M_head_impl,
               (string *)local_438,(Headers *)&decompressed_body,(Progress *)&fs);
    if ((code *)local_408._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_408._M_allocated_capacity)((string *)&fs,(string *)&fs,3);
    }
    uVar10.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
    super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
    super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl =
         fs_1.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
         super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
         super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl;
    fs_1.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
    super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
    super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)
         (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)info._0_8_;
    info.mode = UNKNOWN;
    info._1_7_ = 0;
    if (uVar10.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
        super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
        super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true,_true>)
        0x0) {
      duckdb_httplib::Response::~Response
                ((Response *)
                 uVar10.
                 super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                 .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl);
      operator_delete((void *)uVar10.
                              super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                              .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl);
    }
    _Var9._M_p = info.full_path._M_dataplus._M_p;
    iVar12 = (int)info.full_path._M_dataplus._M_p;
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_318);
    if (info.full_path.field_2._8_8_ != 0) {
      local_318._8_4_ = info.full_path.field_2._M_allocated_capacity._0_4_;
      local_318._16_8_ = info.full_path.field_2._8_8_;
      local_318._24_8_ = info.repository_url._M_dataplus._M_p;
      local_318._32_8_ = info.repository_url._M_string_length;
      *(undefined1 **)(info.full_path.field_2._8_8_ + 8) = local_318 + 8;
      local_2f0._M_p = (pointer)info.repository_url.field_2._M_allocated_capacity;
      info.full_path.field_2._8_8_ = 0;
      info.repository_url._M_dataplus._M_p = (pointer)&info.full_path.field_2;
      info.repository_url.field_2._M_allocated_capacity = 0;
      info.repository_url._M_string_length = (size_type)info.repository_url._M_dataplus._M_p;
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)this_03);
    uVar8 = info._0_8_;
    if (info._0_8_ != 0) {
      duckdb_httplib::Response::~Response((Response *)info._0_8_);
      operator_delete((void *)uVar8);
    }
    info.mode = UNKNOWN;
    info._1_7_ = 0;
    if ((string *)local_438._0_8_ != (string *)(local_438 + 0x10)) {
      operator_delete((void *)local_438._0_8_);
    }
    if (((install_info.
          super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl ==
          (__uniq_ptr_data<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true,_true>
           )0x0) ||
        (fs_1.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
         super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
         super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl ==
         (__uniq_ptr_data<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true,_true>)
         0x0)) ||
       (*(int *)((long)fs_1.
                       super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                       .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl + 0x20) !=
        0x130)) {
      if ((fs_1.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
           super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
           super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl ==
           (__uniq_ptr_data<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true,_true>
           )0x0) ||
         (iVar24 = 3,
         *(int *)((long)fs_1.
                        super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                        .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl + 0x20) !=
         200)) {
        if (iVar12 == 0) {
          uVar21 = *(int *)((long)fs_1.
                                  super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                                  .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl +
                           0x20) - 0x198;
          if ((uVar21 < 0x16) && ((0x200401U >> (uVar21 & 0x1f) & 1) != 0)) goto LAB_01622f57;
          bVar6 = true;
          uVar21 = *(int *)((long)fs_1.
                                  super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                                  .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl +
                           0x20) - 500;
          if ((uVar21 < 5) && ((0x19U >> (uVar21 & 0x1f) & 1) != 0)) goto LAB_01622f57;
        }
        else {
LAB_01622f57:
          bVar6 = false;
        }
        if ((bVar6) || (1 < local_2d0)) {
          info.full_path._M_dataplus._M_p = (pointer)0x0;
          info.full_path._M_string_length = info.full_path._M_string_length & 0xffffffffffffff00;
          info._0_8_ = this_03;
          ExtensionHelper::CreateSuggestions(local_3f8,(string *)&info);
          ExtensionHelper::ExtensionInstallDocumentationLink((string *)&fs,local_3f8);
          this_01 = (HTTPException *)__cxa_allocate_exception(0x10);
          uVar10 = fs_1;
          if (iVar12 == 0) {
            local_438._0_8_ = local_438 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_438,
                       "Failed to download extension \"%s\" at URL \"%s%s\" (HTTP %n)\n%s","");
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            pcVar4 = (local_3f8->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,pcVar4,pcVar4 + local_3f8->_M_string_length);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,url_base._M_dataplus._M_p,
                       url_base._M_dataplus._M_p + url_base._M_string_length);
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_130,url_local_part._M_dataplus._M_p,
                       url_local_part._M_dataplus._M_p + url_local_part._M_string_length);
            local_3f0 = (DatabaseInstance *)
                        (ulong)*(uint *)((long)fs_1.
                                               super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                               ._M_t.
                                               super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                                               .super__Head_base<0UL,_duckdb::FileSystem_*,_false>.
                                               _M_head_impl + 0x20);
            local_150[0] = local_140;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_150,info._0_8_,info.full_path._M_dataplus._M_p + info._0_8_);
            params_4._8_16_ = auStack_458;
            params_4._M_dataplus._M_p = (pointer)local_150;
            params_4.field_2._8_8_ =
                 install_info.
                 super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                 .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl;
            HTTPException::
            HTTPException<duckdb_httplib::Response,_0,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      (this_01,(Response *)
                               uVar10.
                               super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                               .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl,
                       (string *)local_438,&local_90,&local_b0,&local_130,(int)local_3f0,params_4);
            __cxa_throw(this_01,&HTTPException::typeinfo,::std::runtime_error::~runtime_error);
          }
          local_438._0_8_ = local_438 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_438,
                     "Failed to download extension \"%s\" at URL \"%s%s\"\n%s (ERROR %s)","");
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          pcVar4 = (local_3f8->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,pcVar4,pcVar4 + local_3f8->_M_string_length);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,url_base._M_dataplus._M_p,
                     url_base._M_dataplus._M_p + url_base._M_string_length);
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_170,url_local_part._M_dataplus._M_p,
                     url_local_part._M_dataplus._M_p + url_local_part._M_string_length);
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_190,info._0_8_,info.full_path._M_dataplus._M_p + info._0_8_);
          duckdb_httplib::to_string_abi_cxx11_
                    (&local_50,(duckdb_httplib *)((ulong)_Var9._M_p & 0xffffffff),error);
          IOException::
          IOException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    ((IOException *)this_01,(string *)local_438,&local_d0,&local_f0,&local_170,
                     &local_190,&local_50);
          __cxa_throw(this_01,&IOException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_2d0 = local_2d0 + 1;
        dVar5 = exp2((double)(long)local_2d0 + -1.0 + (double)(long)local_2d0 + -1.0);
        uVar18 = (ulong)(dVar5 * 100.0);
        uVar18 = (long)(dVar5 * 100.0 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f | uVar18;
        iVar24 = 0;
        if (0 < (long)uVar18) {
          info._0_8_ = uVar18 / 1000;
          info.full_path._M_dataplus._M_p = (pointer)((uVar18 % 1000) * 1000000);
          do {
            iVar12 = nanosleep((timespec *)&info,(timespec *)&info);
            iVar24 = 0;
            if (iVar12 != -1) break;
            piVar19 = __errno_location();
            iVar24 = 0;
          } while (*piVar19 == 4);
        }
      }
    }
    else {
      *(unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
        *)local_2e8._M_t.
          super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl =
           install_info.
           super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
           .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl;
      install_info.
      super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
      .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
            )(__uniq_ptr_data<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true,_true>
              )0x0;
      iVar24 = 1;
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&decompressed_body);
    if (cli.cli_._M_t.
        super___uniq_ptr_impl<duckdb_httplib::ClientImpl,_std::default_delete<duckdb_httplib::ClientImpl>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb_httplib::ClientImpl_*,_std::default_delete<duckdb_httplib::ClientImpl>_>
        .super__Head_base<0UL,_duckdb_httplib::ClientImpl_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb_httplib::ClientImpl,_std::default_delete<duckdb_httplib::ClientImpl>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)cli.cli_._M_t.
                            super___uniq_ptr_impl<duckdb_httplib::ClientImpl,_std::default_delete<duckdb_httplib::ClientImpl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb_httplib::ClientImpl_*,_std::default_delete<duckdb_httplib::ClientImpl>_>
                            .super__Head_base<0UL,_duckdb_httplib::ClientImpl_*,_false>._M_head_impl
                  + 8))();
    }
    if (iVar24 != 0) {
      if (iVar24 == 3) {
        GZipFileSystem::UncompressGZIPString
                  ((string *)&decompressed_body,
                   (string *)
                   ((long)fs_1.
                          super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                          .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl + 0x78));
        paVar1 = &info.repository_url.field_2;
        info._0_8_ = info._0_8_ & 0xffffffffffffff00;
        info.full_path._M_dataplus._M_p = (pointer)&info.full_path.field_2;
        info.full_path._M_string_length = 0;
        info.full_path.field_2._M_allocated_capacity =
             info.full_path.field_2._M_allocated_capacity & 0xffffffffffffff00;
        info.repository_url._M_string_length = 0;
        info.repository_url.field_2._M_allocated_capacity =
             info.repository_url.field_2._M_allocated_capacity & 0xffffffffffffff00;
        paVar2 = &info.version.field_2;
        info.version._M_string_length = 0;
        info.version.field_2._M_local_buf[0] = '\0';
        paVar3 = &info.etag.field_2;
        info.etag._M_string_length = 0;
        info.etag.field_2._M_local_buf[0] = '\0';
        info.repository_url._M_dataplus._M_p = (pointer)paVar1;
        info.version._M_dataplus._M_p = (pointer)paVar2;
        info.etag._M_dataplus._M_p = (pointer)paVar3;
        CheckExtensionMetadataOnInstall
                  (local_3f0,decompressed_body._M_dataplus._M_p,decompressed_body._M_string_length,
                   &info,local_3f8);
        uVar10 = fs_1;
        fs.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
        super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
        super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl =
             (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)
             (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)&local_408;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&fs,"ETag","");
        cVar20 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)uVar10.
                                  super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                                  .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl +
                           0x48),(key_type *)&fs);
        if (fs.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
            super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
            super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl !=
            (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)&local_408) {
          operator_delete((void *)fs.
                                  super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                                  .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl);
        }
        uVar11.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
        super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
        super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl =
             fs_1.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
             super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl;
        if (cVar20._M_node !=
            (_Base_ptr)
            ((long)uVar10.
                   super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                   .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl + 0x50)) {
          local_438._0_8_ = local_438 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"ETag","");
          pVar26 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)uVar11.
                                           super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                           ._M_t.
                                           super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                                           .super__Head_base<0UL,_duckdb::FileSystem_*,_false>.
                                           _M_head_impl + 0x48),(key_type *)local_438);
          pcVar22 = anon_var_dwarf_4f001a4 + 9;
          if (pVar26.first._M_node._M_node != pVar26.second._M_node._M_node) {
            pcVar22 = *(char **)(pVar26.first._M_node._M_node + 2);
          }
          ::std::__cxx11::string::string((string *)&fs,pcVar22,(allocator *)&cli);
          ::std::__cxx11::string::operator=((string *)&info.etag,(string *)&fs);
          if (fs.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t
              .super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
              .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl !=
              (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)&local_408)
          {
            operator_delete((void *)fs.
                                    super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                                    .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl
                           );
          }
          if ((string *)local_438._0_8_ != (string *)(local_438 + 0x10)) {
            operator_delete((void *)local_438._0_8_);
          }
        }
        psVar23 = (string *)&info.full_path;
        if ((options->repository).ptr == (ExtensionRepository *)0x0) {
          info.mode = CUSTOM_PATH;
        }
        else {
          info.mode = REPOSITORY;
          ::std::__cxx11::string::_M_assign(psVar23);
          optional_ptr<duckdb::ExtensionRepository,_true>::CheckValid(&options->repository);
          psVar23 = (string *)&info.repository_url;
        }
        ::std::__cxx11::string::_M_assign(psVar23);
        FileSystem::CreateLocal();
        pFVar15 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
                  operator*(&fs);
        WriteExtensionFiles(pFVar15,local_2a0,local_298,decompressed_body._M_dataplus._M_p,
                            decompressed_body._M_string_length,&info);
        this_00 = (ExtensionInstallInfo *)operator_new(0x88);
        ExtensionInstallInfo::ExtensionInstallInfo(this_00,&info);
        *(ExtensionInstallInfo **)
         local_2e8._M_t.
         super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
         .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl = this_00;
        if (fs.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
            super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
            super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)fs.
                                super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                                .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl + 8
                      ))();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)info.etag._M_dataplus._M_p != paVar3) {
          operator_delete(info.etag._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)info.version._M_dataplus._M_p != paVar2) {
          operator_delete(info.version._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)info.repository_url._M_dataplus._M_p != paVar1) {
          operator_delete(info.repository_url._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)info.full_path._M_dataplus._M_p != &info.full_path.field_2) {
          operator_delete(info.full_path._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)decompressed_body._M_dataplus._M_p != &decompressed_body.field_2) {
          operator_delete(decompressed_body._M_dataplus._M_p);
        }
      }
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_318);
      uVar10 = fs_1;
      if (fs_1.super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
          super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
          super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true,_true>)
          0x0) {
        duckdb_httplib::Response::~Response
                  ((Response *)
                   fs_1.
                   super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                   .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl);
        operator_delete((void *)uVar10.
                                super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>
                                .super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)url_base._M_dataplus._M_p != &url_base.field_2) {
        operator_delete(url_base._M_dataplus._M_p);
      }
      if (install_info.
          super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true,_true>
           )0x0) {
        ::std::default_delete<duckdb::ExtensionInstallInfo>::operator()
                  ((default_delete<duckdb::ExtensionInstallInfo> *)&install_info,
                   (ExtensionInstallInfo *)
                   install_info.
                   super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                   .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)url_local_part._M_dataplus._M_p != &url_local_part.field_2) {
        operator_delete(url_local_part._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)hostname_without_http._M_dataplus._M_p != &hostname_without_http.field_2) {
        operator_delete(hostname_without_http._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)no_http._M_dataplus._M_p != &no_http.field_2) {
        operator_delete(no_http._M_dataplus._M_p);
      }
      return (unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
              )(_Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                )local_2e8._M_t.
                 super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                 .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl;
    }
  } while( true );
}

Assistant:

static unique_ptr<ExtensionInstallInfo> InstallFromHttpUrl(DatabaseInstance &db, const string &url,
                                                           const string &extension_name, const string &temp_path,
                                                           const string &local_extension_path,
                                                           ExtensionInstallOptions &options,
                                                           optional_ptr<HTTPLogger> http_logger) {
	string no_http = StringUtil::Replace(url, "http://", "");

	idx_t next = no_http.find('/', 0);
	if (next == string::npos) {
		throw IOException("No slash in URL template");
	}

	// Push the substring [last, next) on to splits
	auto hostname_without_http = no_http.substr(0, next);
	auto url_local_part = no_http.substr(next);

	unique_ptr<ExtensionInstallInfo> install_info;
	{
		auto fs = FileSystem::CreateLocal();
		if (fs->FileExists(local_extension_path + ".info")) {
			try {
				install_info =
				    ExtensionInstallInfo::TryReadInfoFile(*fs, local_extension_path + ".info", extension_name);
			} catch (...) {
				if (!options.force_install) {
					// We are going to rewrite the file anyhow, so this is fine
					throw;
				}
			}
		}
	}

	auto url_base = "http://" + hostname_without_http;
	// FIXME: the retry logic should be unified with the retry logic in the httpfs client
	static constexpr idx_t MAX_RETRY_COUNT = 3;
	static constexpr uint64_t RETRY_WAIT_MS = 100;
	static constexpr double RETRY_BACKOFF = 4;
	idx_t retry_count = 0;
	duckdb_httplib::Result res;
	while (true) {
		duckdb_httplib::Client cli(url_base.c_str());
		if (!db.config.options.http_proxy.empty()) {
			idx_t port;
			string host;
			HTTPUtil::ParseHTTPProxyHost(db.config.options.http_proxy, host, port);
			cli.set_proxy(host, NumericCast<int>(port));
		}

		if (!db.config.options.http_proxy_username.empty() || !db.config.options.http_proxy_password.empty()) {
			cli.set_proxy_basic_auth(db.config.options.http_proxy_username, db.config.options.http_proxy_password);
		}

		if (http_logger) {
			cli.set_logger(http_logger->GetLogger<duckdb_httplib::Request, duckdb_httplib::Response>());
		}

		duckdb_httplib::Headers headers = {
		    {"User-Agent", StringUtil::Format("%s %s", db.config.UserAgent(), DuckDB::SourceID())}};

		if (options.use_etags && install_info && !install_info->etag.empty()) {
			headers.insert({"If-None-Match", StringUtil::Format("%s", install_info->etag)});
		}

		res = cli.Get(url_local_part.c_str(), headers);
		if (install_info && res && res->status == 304) {
			return install_info;
		}

		if (res && res->status == 200) {
			// success!
			break;
		}
		// failure - check if we should retry
		bool should_retry = false;
		if (res.error() == duckdb_httplib::Error::Success) {
			switch (res->status) {
			case 408: // Request Timeout
			case 418: // Server is pretending to be a teapot
			case 429: // Rate limiter hit
			case 500: // Server has error
			case 503: // Server has error
			case 504: // Server has error
				should_retry = true;
				break;
			default:
				break;
			}
		} else {
			// always retry on duckdb_httplib::Error::Error
			should_retry = true;
		}
		retry_count++;
		if (!should_retry || retry_count >= MAX_RETRY_COUNT) {
			// if we should not retry or exceeded the number of retries - bubble up the error
			string message;
			ExtensionHelper::CreateSuggestions(extension_name, message);

			auto documentation_link = ExtensionHelper::ExtensionInstallDocumentationLink(extension_name);
			if (!documentation_link.empty()) {
				message += "\nFor more info, visit " + documentation_link;
			}
			if (res.error() == duckdb_httplib::Error::Success) {
				throw HTTPException(res.value(), "Failed to download extension \"%s\" at URL \"%s%s\" (HTTP %n)\n%s",
				                    extension_name, url_base, url_local_part, res->status, message);
			} else {
				throw IOException("Failed to download extension \"%s\" at URL \"%s%s\"\n%s (ERROR %s)", extension_name,
				                  url_base, url_local_part, message, to_string(res.error()));
			}
		}
#ifndef DUCKDB_NO_THREADS
		// retry
		// sleep first
		uint64_t sleep_amount = static_cast<uint64_t>(static_cast<double>(RETRY_WAIT_MS) *
		                                              pow(RETRY_BACKOFF, static_cast<double>(retry_count) - 1));
		std::this_thread::sleep_for(std::chrono::milliseconds(sleep_amount));
#endif
	}
	auto decompressed_body = GZipFileSystem::UncompressGZIPString(res->body);

	ExtensionInstallInfo info;
	CheckExtensionMetadataOnInstall(db, (void *)decompressed_body.data(), decompressed_body.size(), info,
	                                extension_name);
	if (res->has_header("ETag")) {
		info.etag = res->get_header_value("ETag");
	}

	if (options.repository) {
		info.mode = ExtensionInstallMode::REPOSITORY;
		info.full_path = url;
		info.repository_url = options.repository->path;
	} else {
		info.mode = ExtensionInstallMode::CUSTOM_PATH;
		info.full_path = url;
	}

	auto fs = FileSystem::CreateLocal();
	WriteExtensionFiles(*fs, temp_path, local_extension_path, (void *)decompressed_body.data(),
	                    decompressed_body.size(), info);

	return make_uniq<ExtensionInstallInfo>(info);
}